

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAM.cpp
# Opt level: O3

void __thiscall
OpenMD::EAM::addExplicitInteraction
          (EAM *this,AtomType *atype1,AtomType *atype2,RealType dr,int nr,
          vector<double,_std::allocator<double>_> *phiVals)

{
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  *this_00;
  undefined8 *puVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  pair<std::_Rb_tree_iterator<int>,_bool> pVar7;
  pair<double,_double> pVar8;
  int atid2;
  int atid1;
  vector<double,_std::allocator<double>_> rVals;
  CubicSplinePtr cs;
  EAMInteractionData mixer;
  int local_c4;
  double local_c0;
  vector<double,_std::allocator<double>_> local_b8;
  EAM *local_a0;
  AtomType *local_98;
  RealType local_90;
  CubicSpline *local_88;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  CubicSpline *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  undefined8 local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_60;
  undefined8 local_58;
  undefined1 uStack_50;
  undefined7 uStack_4f;
  undefined1 local_48;
  undefined7 uStack_47;
  undefined1 local_40;
  
  local_58 = 0;
  uStack_50 = 0;
  uStack_4f = 0;
  local_68 = 0;
  _Stack_60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_78 = (CubicSpline *)0x0;
  _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88 = (CubicSpline *)0x0;
  local_a0 = (EAM *)atype2;
  local_98 = atype1;
  local_90 = dr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<OpenMD::CubicSpline,std::allocator<OpenMD::CubicSpline>>
            (&local_80,&local_88,(allocator<OpenMD::CubicSpline> *)&local_b8);
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  if (0 < nr) {
    iVar6 = 0;
    do {
      local_c0 = (double)iVar6 * local_90;
      if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_b8,
                   (iterator)
                   local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_c0);
      }
      else {
        *local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = local_c0;
        local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish = local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
      }
      iVar6 = iVar6 + 1;
    } while (nr != iVar6);
  }
  CubicSpline::addPoints(local_88,&local_b8,phiVals);
  local_78 = local_88;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_70,&local_80);
  pVar8 = CubicSpline::getLimits(local_78);
  local_48 = pVar8.second._0_1_;
  uStack_47 = pVar8.second._1_7_;
  local_40 = 1;
  iVar6 = AtomType::getIdent(local_98);
  local_c0 = (double)CONCAT44(local_c0._4_4_,iVar6);
  local_c4 = AtomType::getIdent((AtomType *)local_a0);
  pVar7 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->EAMtypes,(int *)&local_c0);
  if (pVar7.second == false) {
    iVar6 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_c0._0_4_];
  }
  else {
    iVar6 = this->nEAM_;
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_c0._0_4_] = iVar6;
    this->nEAM_ = iVar6 + 1;
  }
  pVar7 = std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
          _M_insert_unique<int_const&>
                    ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     &this->EAMtypes,&local_c4);
  if (pVar7.second == false) {
    iVar4 = (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[local_c4];
    iVar2 = this->nEAM_;
  }
  else {
    iVar4 = this->nEAM_;
    (this->EAMtids).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start[local_c4] = iVar4;
    iVar2 = iVar4 + 1;
    this->nEAM_ = iVar2;
  }
  this_00 = &this->MixingMap;
  std::
  vector<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
  ::resize(this_00,(long)iVar2);
  lVar3 = (long)iVar6;
  local_90 = (RealType)lVar3;
  std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
            ((this->MixingMap).
             super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start + lVar3,(long)this->nEAM_);
  lVar5 = (long)iVar4;
  lVar3 = *(long *)&(this_00->
                    super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start[lVar3].
                    super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                    ._M_impl.super__Vector_impl_data;
  puVar1 = (undefined8 *)(lVar3 + lVar5 * 0x40);
  *puVar1 = local_78;
  local_a0 = this;
  local_98 = (AtomType *)this_00;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1),&_Stack_70);
  puVar1[2] = local_68;
  lVar3 = lVar3 + lVar5 * 0x40;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x18),&_Stack_60);
  *(undefined8 *)(lVar3 + 0x20) = local_58;
  *(ulong *)(lVar3 + 0x28) = CONCAT71(uStack_4f,uStack_50);
  *(ulong *)(lVar3 + 0x29) = CONCAT17(local_48,uStack_4f);
  *(ulong *)(lVar3 + 0x31) = CONCAT17(local_40,uStack_47);
  if (iVar4 != iVar6) {
    std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>::resize
              ((local_a0->MixingMap).
               super__Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + lVar5,(long)local_a0->nEAM_);
    lVar3 = *(long *)&(((_Vector_base<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>,_std::allocator<std::vector<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>_>_>
                         *)&local_98->_vptr_AtomType)->_M_impl).super__Vector_impl_data._M_start
                      [lVar5].
                      super__Vector_base<OpenMD::EAMInteractionData,_std::allocator<OpenMD::EAMInteractionData>_>
                      ._M_impl.super__Vector_impl_data;
    lVar5 = (long)local_90 * 0x40;
    puVar1 = (undefined8 *)(lVar3 + lVar5);
    *puVar1 = local_78;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 1),&_Stack_70);
    puVar1[2] = local_68;
    lVar3 = lVar3 + lVar5;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(lVar3 + 0x18),&_Stack_60);
    *(undefined8 *)(lVar3 + 0x20) = local_58;
    *(ulong *)(lVar3 + 0x28) = CONCAT71(uStack_4f,uStack_50);
    *(ulong *)(lVar3 + 0x29) = CONCAT17(local_48,uStack_4f);
    *(ulong *)(lVar3 + 0x31) = CONCAT17(local_40,uStack_47);
  }
  if (local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
  }
  if (_Stack_60._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_60._M_pi);
  }
  if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
  }
  return;
}

Assistant:

void EAM::addExplicitInteraction(AtomType* atype1, AtomType* atype2,
                                   RealType dr, int nr,
                                   vector<RealType> phiVals) {
    EAMInteractionData mixer;
    CubicSplinePtr cs {std::make_shared<CubicSpline>()};
    vector<RealType> rVals;

    for (int i = 0; i < nr; i++)
      rVals.push_back(i * dr);

    cs->addPoints(rVals, phiVals);
    mixer.phi           = cs;
    mixer.rcut          = mixer.phi->getLimits().second;
    mixer.explicitlySet = true;

    int atid1 = atype1->getIdent();
    int atid2 = atype2->getIdent();

    int eamtid1, eamtid2;

    pair<set<int>::iterator, bool> ret;
    ret = EAMtypes.insert(atid1);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid1 = EAMtids[atid1];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid1        = nEAM_;
      EAMtids[atid1] = nEAM_;
      nEAM_++;
    }

    ret = EAMtypes.insert(atid2);
    if (ret.second == false) {
      // already had this type in the EAMMap, just get the eamtid:
      eamtid2 = EAMtids[atid2];
    } else {
      // didn't already have it, so make a new one and assign it:
      eamtid2        = nEAM_;
      EAMtids[atid2] = nEAM_;
      nEAM_++;
    }

    MixingMap.resize(nEAM_);
    MixingMap[eamtid1].resize(nEAM_);
    MixingMap[eamtid1][eamtid2] = mixer;

    if (eamtid2 != eamtid1) {
      MixingMap[eamtid2].resize(nEAM_);
      MixingMap[eamtid2][eamtid1] = mixer;
    }
    return;
  }